

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O2

void __thiscall QColor::setHsl(QColor *this,int h,int s,int l,int a)

{
  ushort uVar1;
  long in_FS_OFFSET;
  char local_30 [4];
  undefined1 local_2c [16];
  undefined4 local_1c;
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((h < -1) || (0xff < (uint)(l | s | a))) {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_1c = 0;
    local_2c = (undefined1  [16])0x0;
    local_18 = "default";
    QMessageLogger::warning(local_30,"QColor::setHsl: HSL parameters out of range");
    this->cspec = Invalid;
    (this->ct).argb.alpha = 0xffff;
    *(undefined8 *)((long)&this->ct + 2) = 0;
  }
  else {
    this->cspec = Hsl;
    (this->ct).argb.alpha = (short)a * 0x101;
    if (h == -1) {
      uVar1 = 0xffff;
    }
    else {
      uVar1 = (short)((uint)h % 0x168) * 100;
    }
    (this->ct).argb.red = uVar1;
    *(uint *)((long)&this->ct + 4) = CONCAT22((short)l * 0x101,(short)s * 0x101);
    (this->ct).argb.pad = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColor::setHsl(int h, int s, int l, int a)
{
    if (h < -1 || (uint)s > 255 || (uint)l > 255 || (uint)a > 255) {
        qWarning("QColor::setHsl: HSL parameters out of range");
        invalidate();
        return;
    }

    cspec = Hsl;
    ct.ahsl.alpha      = a * 0x101;
    ct.ahsl.hue        = h == -1 ? USHRT_MAX : (h % 360) * 100;
    ct.ahsl.saturation = s * 0x101;
    ct.ahsl.lightness  = l * 0x101;
    ct.ahsl.pad        = 0;
}